

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightweight_test.hpp
# Opt level: O2

void __thiscall
trial::protocol::core::detail::test_close_impl<long_double>
          (detail *this,char *expr1,char *expr2,char *file,int line,char *function,longdouble *lhs,
          longdouble *rhs,longdouble tolerance)

{
  ostream *poVar1;
  undefined4 in_register_00000084;
  
  if (tolerance < ABS(*(longdouble *)function - *lhs)) {
    poVar1 = std::operator<<((ostream *)&std::cerr,expr2);
    poVar1 = std::operator<<(poVar1,"(");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)file);
    poVar1 = std::operator<<(poVar1,"): test \'");
    poVar1 = std::operator<<(poVar1,(char *)this);
    poVar1 = std::operator<<(poVar1," == ");
    poVar1 = std::operator<<(poVar1,expr1);
    poVar1 = std::operator<<(poVar1,"\' failed in function \'");
    poVar1 = std::operator<<(poVar1,(char *)CONCAT44(in_register_00000084,line));
    poVar1 = std::operator<<(poVar1,"\': ");
    std::operator<<(poVar1,"\'");
    poVar1 = std::ostream::_M_insert<long_double>(*(longdouble *)function);
    std::operator<<(poVar1,"\' != \'");
    poVar1 = std::ostream::_M_insert<long_double>(*lhs);
    poVar1 = std::operator<<(poVar1,"\'");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  boost::detail::test_results();
  return;
}

Assistant:

inline void test_close_impl(char const * expr1,
                            char const * expr2,
                            char const * file, int line, char const * function,
                            const T& lhs, const T& rhs, T tolerance)
{
    if (std::fabs(lhs - rhs) <= tolerance)
    {
        test_success();
    }
    else
    {
        BOOST_LIGHTWEIGHT_TEST_OSTREAM
            << file << "(" << line << "): test '" << expr1 << " == " << expr2
            << "' failed in function '" << function << "': "
            << "'" << lhs << "' != '" << rhs << "'" << std::endl;
        test_failure();
    }
}